

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O2

void __thiscall script_p2sh_tests::AreInputsStandard::test_method(AreInputsStandard *this)

{
  uchar *puVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  pointer pbVar4;
  pointer pCVar5;
  size_type sVar6;
  uint uVar7;
  long lVar8;
  CScript *pCVar9;
  ulong uVar10;
  undefined8 uVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  CMutableTransaction *pCVar14;
  CMutableTransaction *pCVar15;
  int i;
  int iVar16;
  long lVar17;
  CKey *this_00;
  long in_FS_OFFSET;
  bool bVar18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file_01;
  span<const_std::byte,_18446744073709551615UL> b_05;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  span<const_std::byte,_18446744073709551615UL> b_06;
  span<const_std::byte,_18446744073709551615UL> b_07;
  const_string file_08;
  const_string file_09;
  span<const_std::byte,_18446744073709551615UL> b_08;
  const_string file_10;
  const_string file_11;
  span<const_std::byte,_18446744073709551615UL> b_09;
  const_string file_12;
  const_string file_13;
  check_type cVar19;
  PKHash *this_01;
  iterator local_1348;
  char *local_1340;
  char *local_1338;
  undefined1 *local_1330;
  undefined1 *local_1328;
  char *local_1320;
  char *local_1318;
  char *local_1310;
  char *local_1308;
  undefined1 *local_1300;
  undefined1 *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12e0;
  char *local_12d8;
  undefined1 *local_12d0;
  undefined1 *local_12c8;
  char *local_12c0;
  char *local_12b8;
  char *local_12b0;
  char *local_12a8;
  undefined1 *local_12a0;
  undefined1 *local_1298;
  char *local_1290;
  char *local_1288;
  CMutableTransaction txToNonStd1;
  char *local_1248;
  char *local_1240;
  undefined1 *local_1238;
  undefined1 *local_1230;
  char *local_1228;
  char *local_1220;
  char *local_1218;
  char *local_1210;
  undefined1 *local_1208;
  undefined1 *local_1200;
  char *local_11f8;
  char *local_11f0;
  char *local_11e8;
  char *local_11e0;
  undefined1 *local_11d8;
  undefined1 *local_11d0;
  char *local_11c8;
  char *local_11c0;
  char *local_11b8;
  char *local_11b0;
  undefined1 *local_11a8;
  undefined1 *local_11a0;
  char *local_1198;
  char *local_1190;
  char *local_1188;
  char *local_1180;
  undefined1 *local_1178;
  undefined1 *local_1170;
  char *local_1168;
  char *local_1160;
  CMutableTransaction txTo;
  char *local_1120;
  char *local_1118;
  undefined1 *local_1110;
  undefined1 *local_1108;
  char *local_1100;
  char *local_10f8;
  char *local_10f0;
  char *local_10e8;
  undefined1 *local_10e0;
  undefined1 *local_10d8;
  char *local_10d0;
  char *local_10c8;
  char *local_10c0;
  char *local_10b8;
  undefined1 *local_10b0;
  undefined1 *local_10a8;
  char *local_10a0;
  char *local_1098;
  char *local_1090;
  char *local_1088;
  undefined1 *local_1080;
  undefined1 *local_1078;
  char *local_1070;
  char *local_1068;
  char *local_1060;
  char *local_1058;
  undefined1 *local_1050;
  undefined1 *local_1048;
  char *local_1040;
  char *local_1038;
  CMutableTransaction txFrom;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  char *local_fd8;
  char *local_fd0;
  undefined1 *local_fc8;
  undefined1 *local_fc0;
  char *local_fb8;
  char *local_fb0;
  CCoinsView coinsDummy;
  pointer local_fa0;
  element_type *peStack_f98;
  uchar local_f90 [8];
  undefined1 local_f88 [32];
  CMutableTransaction txToNonStd2;
  undefined1 local_f30 [8];
  element_type *local_f28;
  shared_count sStack_f20;
  CMutableTransaction *local_f18;
  undefined1 local_ee8 [16];
  shared_count local_ed8 [7];
  uchar local_ea0;
  SignatureData empty_c;
  SignatureData empty_b;
  SignatureData empty;
  CScript twentySigops;
  CScript sixteenSigops;
  CScript fifteenSigops;
  CScript oneAndTwo;
  CScript pay1of3;
  CScript pay1;
  CKey key [6];
  FillableSigningProvider keystore;
  CCoinsViewCache coins;
  
  txFrom.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  coinsDummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_01149610;
  CCoinsViewCache::CCoinsViewCache(&coins,&coinsDummy,false);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  lVar8 = 8;
  do {
    *(undefined1 *)((long)key + lVar8 + -8) = 0;
    *(undefined8 *)(&key[0].fCompressed + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x68);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar8 = 0; lVar8 != 0x60; lVar8 = lVar8 + 0x10) {
    CKey::MakeNewKey((CKey *)(&key[0].fCompressed + lVar8),true);
    local_fb8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_fb0 = "";
    local_fc8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_fc0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x11f;
    file.m_begin = (iterator)&local_fb8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_fc8,msg);
    empty_b.complete =
         FillableSigningProvider::AddKey(&keystore,(CKey *)(&key[0].fCompressed + lVar8));
    empty_b.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    empty_b.scriptSig.super_CScriptBase._union._8_8_ = 0;
    empty_c._0_8_ = anon_var_dwarf_a3356b;
    empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect = "";
    empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
         (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
                 0xffffffffffffff00);
    empty._0_8_ = &PTR__lazy_ostream_0113a070;
    empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
    empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
    local_fd8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_fd0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar19,
               (size_t)&local_fd8,0x11f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  }
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve(&keys,3);
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
    CKey::GetPubKey((CPubKey *)&empty,(CKey *)(&key[0].fCompressed + lVar8));
    std::vector<CPubKey,_std::allocator<CPubKey>_>::emplace_back<CPubKey>(&keys,(CPubKey *)&empty);
  }
  CMutableTransaction::CMutableTransaction(&txFrom);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txFrom.vout,7);
  CKey::GetPubKey((CPubKey *)&empty_b,key);
  PKHash::PKHash((PKHash *)&empty_c,(CPubKey *)&empty_b);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x02';
  GetScriptForDestination(&pay1,(CTxDestination *)&empty);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  local_1040 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1038 = "";
  local_1050 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1048 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x12b;
  file_00.m_begin = (iterator)&local_1040;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1050,
             msg_00);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,&pay1);
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  empty_b.scriptSig.super_CScriptBase._union._8_8_ = 0;
  empty_c._0_8_ = anon_var_dwarf_e4d12f;
  empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect = "";
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_0113a070;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1060 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1058 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar19,
             (size_t)&local_1060,299);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  GetScriptForMultisig(&pay1of3,1,&keys);
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,&pay1);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  (txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             &pay1.super_CScriptBase);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 2000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,
             &pay1of3.super_CScriptBase);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[2].nValue = 3000;
  oneAndTwo.super_CScriptBase._union._16_8_ = 0;
  oneAndTwo.super_CScriptBase._24_8_ = 0;
  oneAndTwo.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  oneAndTwo.super_CScriptBase._union._8_8_ = 0;
  pCVar9 = CScript::operator<<(&oneAndTwo,OP_1);
  this_00 = key;
  CKey::GetPubKey((CPubKey *)&empty,this_00);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_ee8,(CPubKey *)&empty);
  b._M_extent._M_extent_value = local_ee8._8_8_ - local_ee8._0_8_;
  b._M_ptr = (pointer)local_ee8._0_8_;
  pCVar9 = CScript::operator<<(pCVar9,b);
  CKey::GetPubKey((CPubKey *)&empty_b,key + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f30,(CPubKey *)&empty_b)
  ;
  b_00._M_extent._M_extent_value = (long)local_f28 - (long)local_f30;
  b_00._M_ptr = (pointer)local_f30;
  pCVar9 = CScript::operator<<(pCVar9,b_00);
  CKey::GetPubKey((CPubKey *)&empty_c,key + 2);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txTo,(CPubKey *)&empty_c);
  b_01._M_extent._M_extent_value =
       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_01._M_ptr = (pointer)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start;
  CScript::operator<<(pCVar9,b_01);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txTo);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_ee8);
  pCVar9 = CScript::operator<<(&oneAndTwo,OP_3);
  CScript::operator<<(pCVar9,OP_CHECKMULTISIGVERIFY);
  pCVar9 = CScript::operator<<(&oneAndTwo,OP_2);
  CKey::GetPubKey((CPubKey *)&empty,key + 3);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_ee8,(CPubKey *)&empty);
  b_02._M_extent._M_extent_value = local_ee8._8_8_ - local_ee8._0_8_;
  b_02._M_ptr = (pointer)local_ee8._0_8_;
  pCVar9 = CScript::operator<<(pCVar9,b_02);
  CKey::GetPubKey((CPubKey *)&empty_b,key + 4);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f30,(CPubKey *)&empty_b)
  ;
  b_03._M_extent._M_extent_value = (long)local_f28 - (long)local_f30;
  b_03._M_ptr = (pointer)local_f30;
  pCVar9 = CScript::operator<<(pCVar9,b_03);
  CKey::GetPubKey((CPubKey *)&empty_c,key + 5);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txTo,(CPubKey *)&empty_c);
  b_04._M_extent._M_extent_value =
       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_04._M_ptr = (pointer)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start;
  CScript::operator<<(pCVar9,b_04);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txTo);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_ee8);
  pCVar9 = CScript::operator<<(&oneAndTwo,OP_3);
  CScript::operator<<(pCVar9,OP_CHECKMULTISIG);
  local_1070 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1068 = "";
  local_1080 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1078 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar13;
  msg_01.m_begin = pvVar12;
  file_01.m_end = (iterator)0x13c;
  file_01.m_begin = (iterator)&local_1070;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1080,
             msg_01);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,&oneAndTwo);
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  empty_b.scriptSig.super_CScriptBase._union._8_8_ = 0;
  empty_c._0_8_ = anon_var_dwarf_e4d149;
  empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect = "";
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_0113a070;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1090 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1088 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar19,
             (size_t)&local_1090,0x13c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  local_1348.ptr = (uchar *)&oneAndTwo;
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,(CScript *)local_1348.ptr);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[3].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[3].nValue = 4000;
  fifteenSigops.super_CScriptBase._union._16_8_ = 0;
  fifteenSigops.super_CScriptBase._24_8_ = 0;
  fifteenSigops.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  fifteenSigops.super_CScriptBase._union._8_8_ = 0;
  CScript::operator<<(&fifteenSigops,OP_1);
  iVar16 = 0xf;
  uVar10 = 0;
  while( true ) {
    bVar18 = iVar16 == 0;
    iVar16 = iVar16 + -1;
    if (bVar18) break;
    CKey::GetPubKey((CPubKey *)&empty,this_00 + (uVar10 / 3) * -3);
    ToByteVector<CPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_b,(CPubKey *)&empty);
    pbVar4 = (pointer)CONCAT62(empty_b._2_6_,CONCAT11(empty_b.witness,empty_b.complete));
    b_05._M_extent._M_extent_value =
         (long)empty_b.scriptSig.super_CScriptBase._union.indirect_contents.indirect - (long)pbVar4;
    b_05._M_ptr = pbVar4;
    CScript::operator<<(&fifteenSigops,b_05);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_b);
    this_00 = this_00 + 1;
    uVar10 = uVar10 + 1;
  }
  pCVar9 = CScript::operator<<(&fifteenSigops,OP_15);
  CScript::operator<<(pCVar9,OP_CHECKMULTISIG);
  local_10a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1098 = "";
  local_10b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar13;
  msg_02.m_begin = pvVar12;
  file_02.m_end = (iterator)0x145;
  file_02.m_begin = (iterator)&local_10a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_10b0,
             msg_02);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,&fifteenSigops);
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  empty_b.scriptSig.super_CScriptBase._union._8_8_ = 0;
  empty_c._0_8_ = anon_var_dwarf_e4d178;
  empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect = "";
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_0113a070;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  local_10c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_10b8 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar19,
             (size_t)&local_10c0,0x145);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,&fifteenSigops);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[4].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[4].nValue = 5000;
  sixteenSigops.super_CScriptBase._union._16_8_ = 0;
  sixteenSigops.super_CScriptBase._24_8_ = 0;
  sixteenSigops.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  sixteenSigops.super_CScriptBase._union._8_8_ = 0;
  pCVar9 = CScript::operator<<(&sixteenSigops,OP_16);
  CScript::operator<<(pCVar9,OP_CHECKMULTISIG);
  local_10d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_10c8 = "";
  local_10e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar13;
  msg_03.m_begin = pvVar12;
  file_03.m_end = (iterator)0x14b;
  file_03.m_begin = (iterator)&local_10d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_10e0,
             msg_03);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,&sixteenSigops);
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  empty_b.scriptSig.super_CScriptBase._union._8_8_ = 0;
  empty_c._0_8_ = anon_var_dwarf_e4d192;
  empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect = "";
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_0113a070;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_10f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_10e8 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar19,
             (size_t)&local_10f0,0x14b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,&sixteenSigops);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[5].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[5].nValue = 5000;
  twentySigops.super_CScriptBase._union._16_8_ = 0;
  twentySigops.super_CScriptBase._24_8_ = 0;
  twentySigops.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  twentySigops.super_CScriptBase._union._8_8_ = 0;
  CScript::operator<<(&twentySigops,OP_CHECKMULTISIG);
  local_1100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_10f8 = "";
  local_1110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1108 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar13;
  msg_04.m_begin = pvVar12;
  file_04.m_end = (iterator)0x14f;
  file_04.m_begin = (iterator)&local_1100;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1110,
             msg_04);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,&twentySigops);
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  empty_b.scriptSig.super_CScriptBase._union._8_8_ = 0;
  empty_c._0_8_ = anon_var_dwarf_e4d19e;
  empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect = "";
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_0113a070;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1118 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar19,
             (size_t)&local_1120,0x14f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,&twentySigops);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[6].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_b);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[6].nValue = 6000;
  CTransaction::CTransaction((CTransaction *)&empty,&txFrom);
  AddCoins(&coins,(CTransaction *)&empty,0,false);
  CTransaction::~CTransaction((CTransaction *)&empty);
  CMutableTransaction::CMutableTransaction(&txTo);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txTo.vout,1);
  CKey::GetPubKey((CPubKey *)&empty_b,key + 1);
  PKHash::PKHash((PKHash *)local_ee8,(CPubKey *)&empty_b);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity = local_ed8[0].pi_._0_4_;
  empty.complete = (bool)local_ee8[0];
  empty.witness = (bool)local_ee8[1];
  empty._2_6_ = local_ee8._2_6_;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)local_ee8._8_8_;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x02';
  GetScriptForDestination((CScript *)&empty_c,(CTxDestination *)&empty);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txTo.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_c);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty_c);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txTo.vin,5);
  lVar8 = 0;
  for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
    *(int *)((long)(&((txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout).hash + 1) + lVar8) = (int)lVar17;
    CMutableTransaction::GetHash((Txid *)&empty,&txFrom);
    puVar1 = ((txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar8 + 0x10;
    *(undefined8 *)puVar1 = empty.scriptSig.super_CScriptBase._union._8_8_;
    *(undefined8 *)(puVar1 + 8) = empty.scriptSig.super_CScriptBase._union._16_8_;
    puVar1 = ((txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar8;
    puVar1[0] = empty.complete;
    puVar1[1] = empty.witness;
    puVar1[2] = empty._2_1_;
    puVar1[3] = empty._3_1_;
    puVar1[4] = empty._4_1_;
    puVar1[5] = empty._5_1_;
    puVar1[6] = empty._6_1_;
    puVar1[7] = empty._7_1_;
    *(char **)(puVar1 + 8) = empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
    lVar8 = lVar8 + 0x68;
  }
  empty._0_8_ = empty._0_8_ & 0xffffffffffff0000;
  p_Var2 = &empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  memset(&empty.scriptSig,0,0xb8);
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1160 = "";
  local_1178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar13;
  msg_05.m_begin = pvVar12;
  file_05.m_end = (iterator)0x160;
  file_05.m_begin = (iterator)&local_1168;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1178,
             msg_05);
  CTransaction::CTransaction((CTransaction *)&empty_b,&txFrom);
  bVar18 = SignSignature(&keystore.super_SigningProvider,(CTransaction *)&empty_b,&txTo,0,1,&empty);
  local_ee8[0] = bVar18;
  local_ee8._8_8_ = (element_type *)0x0;
  local_ed8[0].pi_ = (sp_counted_base *)0x0;
  local_f30 = (undefined1  [8])0xbc1f43;
  local_f28 = (element_type *)0xbc1f8d;
  empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty_c.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty_c._0_8_ = &PTR__lazy_ostream_0113a070;
  empty_c.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1180 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  empty_c.scriptSig.super_CScriptBase._union._16_8_ = local_f30;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ee8,(lazy_ostream *)&empty_c,1,0,WARN,_cVar19,
             (size_t)&local_1188,0x160);
  boost::detail::shared_count::~shared_count(local_ed8);
  CTransaction::~CTransaction((CTransaction *)&empty_b);
  empty_b.complete = false;
  empty_b.witness = false;
  p_Var2 = &empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&empty_b.scriptSig,0,0xb8);
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty_b.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_b.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  empty_b.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  empty_b.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_b.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_b.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_b.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1190 = "";
  local_11a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar13;
  msg_06.m_begin = pvVar12;
  file_06.m_end = (iterator)0x162;
  file_06.m_begin = (iterator)&local_1198;
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_11a8,
             msg_06);
  CTransaction::CTransaction((CTransaction *)&empty_c,&txFrom);
  bVar18 = SignSignature(&keystore.super_SigningProvider,(CTransaction *)&empty_c,&txTo,1,1,&empty_b
                        );
  local_f30[0] = bVar18;
  local_f28 = (element_type *)0x0;
  sStack_f20.pi_ = (sp_counted_base *)0x0;
  local_ed8[1].pi_ = (sp_counted_base *)&txToNonStd1;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_e4d1d2;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbc1fda;
  local_ee8._8_8_ = local_ee8._8_8_ & 0xffffffffffffff00;
  local_ee8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_ed8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_11b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_11b0 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f30,(lazy_ostream *)local_ee8,1,0,WARN,_cVar19,
             (size_t)&local_11b8,0x162);
  boost::detail::shared_count::~shared_count(&sStack_f20);
  CTransaction::~CTransaction((CTransaction *)&empty_c);
  empty_c._0_8_ = empty_c._0_8_ & 0xffffffffffff0000;
  p_Var2 = &empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&empty_c.scriptSig,0,0xb8);
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty_c.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_c.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  empty_c.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  empty_c.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_c.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_c.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_c.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_11c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_11c0 = "";
  local_11d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar13;
  msg_07.m_begin = pvVar12;
  file_07.m_end = (iterator)0x164;
  file_07.m_begin = (iterator)&local_11c8;
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_11d8,
             msg_07);
  CTransaction::CTransaction((CTransaction *)local_ee8,&txFrom);
  bVar18 = SignSignature(&keystore.super_SigningProvider,(CTransaction *)local_ee8,&txTo,2,1,
                         &empty_c);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,bVar18);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pCVar15 = &txToNonStd2;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_e4d1ec;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbc2027;
  local_f28 = (element_type *)((ulong)local_f28 & 0xffffffffffffff00);
  local_f30 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_f20.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_11e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_11e0 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  local_f18 = pCVar15;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txToNonStd1,(lazy_ostream *)local_f30,1,0,WARN,_cVar19,
             (size_t)&local_11e8,0x164);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CTransaction::~CTransaction((CTransaction *)local_ee8);
  pCVar9 = CScript::operator<<(&txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start[3].scriptSig,OP_11);
  pCVar9 = CScript::operator<<(pCVar9,OP_11);
  sVar6 = oneAndTwo.super_CScriptBase._size;
  if (0x1c < oneAndTwo.super_CScriptBase._size) {
    local_1348.ptr = (uchar *)oneAndTwo.super_CScriptBase._union.indirect_contents.indirect;
    sVar6 = oneAndTwo.super_CScriptBase._size - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_ee8,local_1348,
             (iterator)(local_1348.ptr + (int)sVar6),(allocator_type *)local_f30);
  b_06._M_extent._M_extent_value = local_ee8._8_8_ - local_ee8._0_8_;
  b_06._M_ptr = (pointer)local_ee8._0_8_;
  CScript::operator<<(pCVar9,b_06);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_ee8);
  uVar11 = &fifteenSigops;
  sVar6 = fifteenSigops.super_CScriptBase._size;
  if (0x1c < fifteenSigops.super_CScriptBase._size) {
    uVar11 = fifteenSigops.super_CScriptBase._union.indirect_contents.indirect;
    sVar6 = fifteenSigops.super_CScriptBase._size - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_ee8,(iterator)uVar11,
             (uchar *)(uVar11 + (long)(int)sVar6),(allocator_type *)local_f30);
  b_07._M_extent._M_extent_value = local_ee8._8_8_ - local_ee8._0_8_;
  b_07._M_ptr = (pointer)local_ee8._0_8_;
  CScript::operator<<(&txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start[4].scriptSig,b_07);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_ee8);
  local_11f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_11f0 = "";
  local_1208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar13;
  msg_08.m_begin = pvVar12;
  file_08.m_end = (iterator)0x16b;
  file_08.m_begin = (iterator)&local_11f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_1208,
             msg_08);
  CTransaction::CTransaction((CTransaction *)local_ee8,&txTo);
  bVar18 = ::AreInputsStandard((CTransaction *)local_ee8,&coins);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,bVar18);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_e4d1f8;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbc2056;
  local_f28 = (element_type *)((ulong)local_f28 & 0xffffffffffffff00);
  local_f30 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_f20.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1210 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  local_f18 = pCVar15;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txToNonStd1,(lazy_ostream *)local_f30,1,0,WARN,_cVar19,
             (size_t)&local_1218,0x16b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CTransaction::~CTransaction((CTransaction *)local_ee8);
  local_1228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1220 = "";
  local_1238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar13;
  msg_09.m_begin = pvVar12;
  file_09.m_end = (iterator)0x16d;
  file_09.m_begin = (iterator)&local_1228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_1238,
             msg_09);
  local_f28 = (element_type *)((ulong)local_f28 & 0xffffffffffffff00);
  local_f30 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  sStack_f20.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f18 = (CMutableTransaction *)0xc694e1;
  local_1248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1240 = "";
  CTransaction::CTransaction((CTransaction *)local_ee8,&txTo);
  uVar7 = GetP2SHSigOpCount((CTransaction *)local_ee8,&coins);
  pCVar14 = &txToNonStd1;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,uVar7);
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x16);
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_f30,&local_1248,0x16d,1,2,pCVar14,"GetP2SHSigOpCount(CTransaction(txTo), coins)",
             pCVar15,"22U");
  CTransaction::~CTransaction((CTransaction *)local_ee8);
  CMutableTransaction::CMutableTransaction(&txToNonStd1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txToNonStd1.vout,1);
  CKey::GetPubKey((CPubKey *)local_f30,key + 1);
  this_01 = (PKHash *)local_f88;
  PKHash::PKHash(this_01,(CPubKey *)local_f30);
  local_ed8[0].pi_._0_4_ = local_f88._16_4_;
  local_ee8._0_8_ = local_f88._0_8_;
  local_ee8._8_8_ = local_f88._8_8_;
  local_ea0 = '\x02';
  GetScriptForDestination((CScript *)&txToNonStd2,(CTxDestination *)local_ee8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txToNonStd1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txToNonStd2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txToNonStd2);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_ee8);
  (txToNonStd1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 1000;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txToNonStd1.vin,1);
  ((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start)->prevout).n = 5;
  CMutableTransaction::GetHash((Txid *)local_ee8,&txFrom);
  pCVar5 = txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(sp_counted_base **)
   (((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_ed8[0].pi_;
  *(sp_counted_base **)
   (((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = local_ed8[1].pi_;
  *(undefined8 *)
   ((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
   _M_elems = local_ee8._0_8_;
  *(undefined8 *)
   (((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = local_ee8._8_8_;
  uVar11 = &sixteenSigops;
  sVar6 = sixteenSigops.super_CScriptBase._size;
  if (0x1c < sixteenSigops.super_CScriptBase._size) {
    uVar11 = sixteenSigops.super_CScriptBase._union.indirect_contents.indirect;
    sVar6 = sixteenSigops.super_CScriptBase._size - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_ee8,(iterator)uVar11,
             (uchar *)(uVar11 + (long)(int)sVar6),(allocator_type *)local_f30);
  b_08._M_extent._M_extent_value = local_ee8._8_8_ - local_ee8._0_8_;
  b_08._M_ptr = (pointer)local_ee8._0_8_;
  CScript::operator<<(&pCVar5->scriptSig,b_08);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_ee8);
  local_1290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1288 = "";
  local_12a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1298 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pCVar14;
  msg_10.m_begin = pvVar12;
  file_10.m_end = (iterator)0x178;
  file_10.m_begin = (iterator)&local_1290;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_12a0,
             msg_10);
  CTransaction::CTransaction((CTransaction *)local_ee8,&txToNonStd1);
  bVar18 = ::AreInputsStandard((CTransaction *)local_ee8,&coins);
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,!bVar18);
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f88._0_8_ = "!::AreInputsStandard(CTransaction(txToNonStd1), coins)";
  local_f88._8_8_ = (long)"!::AreInputsStandard(CTransaction(txToNonStd1), coins)" + 0x36;
  local_f28 = (element_type *)((ulong)local_f28 & 0xffffffffffffff00);
  local_f30 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_f20.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_12b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_12a8 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  local_f18 = (CMutableTransaction *)this_01;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txToNonStd2,(lazy_ostream *)local_f30,1,0,WARN,(check_type)pCVar15
             ,(size_t)&local_12b0,0x178);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CTransaction::~CTransaction((CTransaction *)local_ee8);
  local_12c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_12b8 = "";
  local_12d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar13;
  msg_11.m_begin = pvVar12;
  file_11.m_end = (iterator)0x179;
  file_11.m_begin = (iterator)&local_12c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_12d0,
             msg_11);
  local_f28 = (element_type *)((ulong)local_f28 & 0xffffffffffffff00);
  local_f30 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  sStack_f20.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f18 = (CMutableTransaction *)0xc694e1;
  local_12e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_12d8 = "";
  CTransaction::CTransaction((CTransaction *)local_ee8,&txToNonStd1);
  uVar7 = GetP2SHSigOpCount((CTransaction *)local_ee8,&coins);
  pCVar15 = &txToNonStd2;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,uVar7);
  local_f88._0_4_ = 0x10;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_f30,&local_12e0,0x179,1,2,pCVar15,
             "GetP2SHSigOpCount(CTransaction(txToNonStd1), coins)",this_01,"16U");
  CTransaction::~CTransaction((CTransaction *)local_ee8);
  CMutableTransaction::CMutableTransaction(&txToNonStd2);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txToNonStd2.vout,1);
  CKey::GetPubKey((CPubKey *)local_f30,key + 1);
  PKHash::PKHash((PKHash *)&local_fa0,(CPubKey *)local_f30);
  local_ed8[0].pi_._0_1_ = local_f90[0];
  local_ed8[0].pi_._1_1_ = local_f90[1];
  local_ed8[0].pi_._2_1_ = local_f90[2];
  local_ed8[0].pi_._3_1_ = local_f90[3];
  local_ee8._0_8_ = local_fa0;
  local_ee8._8_8_ = peStack_f98;
  local_ea0 = '\x02';
  GetScriptForDestination((CScript *)local_f88,(CTxDestination *)local_ee8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_f88);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_f88);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_ee8);
  (txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 1000;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txToNonStd2.vin,1);
  ((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start)->prevout).n = 6;
  CMutableTransaction::GetHash((Txid *)local_ee8,&txFrom);
  pCVar5 = txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(sp_counted_base **)
   (((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_ed8[0].pi_;
  *(sp_counted_base **)
   (((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = local_ed8[1].pi_;
  *(undefined8 *)
   ((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
   _M_elems = local_ee8._0_8_;
  *(undefined8 *)
   (((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = local_ee8._8_8_;
  uVar11 = &twentySigops;
  sVar6 = twentySigops.super_CScriptBase._size;
  if (0x1c < twentySigops.super_CScriptBase._size) {
    uVar11 = twentySigops.super_CScriptBase._union.indirect_contents.indirect;
    sVar6 = twentySigops.super_CScriptBase._size - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_ee8,(iterator)uVar11,
             (uchar *)(uVar11 + (long)(int)sVar6),(allocator_type *)local_f30);
  b_09._M_extent._M_extent_value = local_ee8._8_8_ - local_ee8._0_8_;
  b_09._M_ptr = (pointer)local_ee8._0_8_;
  CScript::operator<<(&pCVar5->scriptSig,b_09);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_ee8);
  local_12f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_12e8 = "";
  local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pCVar15;
  msg_12.m_begin = pvVar12;
  file_12.m_end = (iterator)0x184;
  file_12.m_begin = (iterator)&local_12f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_1300,
             msg_12);
  CTransaction::CTransaction((CTransaction *)local_ee8,&txToNonStd2);
  bVar18 = ::AreInputsStandard((CTransaction *)local_ee8,&coins);
  local_f88[0] = !bVar18;
  local_f88[8] = '\0';
  local_f88[9] = '\0';
  local_f88[10] = '\0';
  local_f88[0xb] = '\0';
  local_f88[0xc] = '\0';
  local_f88[0xd] = '\0';
  local_f88[0xe] = '\0';
  local_f88[0xf] = '\0';
  local_f88._16_8_ = 0;
  local_fa0 = (pointer)0xbc20f3;
  peStack_f98 = (element_type *)0xbc2129;
  local_f28 = (element_type *)((ulong)local_f28 & 0xffffffffffffff00);
  local_f30 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_f20.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1308 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  local_f18 = (CMutableTransaction *)&local_fa0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f88,(lazy_ostream *)local_f30,1,0,WARN,(check_type)this_01,
             (size_t)&local_1310,0x184);
  boost::detail::shared_count::~shared_count((shared_count *)(local_f88 + 0x10));
  CTransaction::~CTransaction((CTransaction *)local_ee8);
  local_1320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1318 = "";
  local_1330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1328 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar13;
  msg_13.m_begin = pvVar12;
  file_13.m_end = (iterator)0x185;
  file_13.m_begin = (iterator)&local_1320;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_1330,
             msg_13);
  local_f28 = (element_type *)((ulong)local_f28 & 0xffffffffffffff00);
  local_f30 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  sStack_f20.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f18 = (CMutableTransaction *)0xc694e1;
  local_1340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1338 = "";
  CTransaction::CTransaction((CTransaction *)local_ee8,&txToNonStd2);
  uVar7 = GetP2SHSigOpCount((CTransaction *)local_ee8,&coins);
  local_f88._0_4_ = uVar7;
  local_fa0 = (pointer)CONCAT44(local_fa0._4_4_,0x14);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_f30,&local_1340,0x185,1,2,local_f88,
             "GetP2SHSigOpCount(CTransaction(txToNonStd2), coins)",(PKHash *)&local_fa0,"20U");
  CTransaction::~CTransaction((CTransaction *)local_ee8);
  CMutableTransaction::~CMutableTransaction(&txToNonStd2);
  CMutableTransaction::~CMutableTransaction(&txToNonStd1);
  SignatureData::~SignatureData(&empty_c);
  SignatureData::~SignatureData(&empty_b);
  SignatureData::~SignatureData(&empty);
  CMutableTransaction::~CMutableTransaction(&txTo);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&twentySigops.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&sixteenSigops.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&fifteenSigops.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&oneAndTwo.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&pay1of3.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&pay1.super_CScriptBase);
  CMutableTransaction::~CMutableTransaction(&txFrom);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            (&keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>);
  lVar8 = 0x58;
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)(&key[0].fCompressed + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -8);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  CCoinsViewCache::~CCoinsViewCache(&coins);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(AreInputsStandard)
{
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    FillableSigningProvider keystore;
    CKey key[6];
    for (int i = 0; i < 6; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
    }
    std::vector<CPubKey> keys;
    keys.reserve(3);
    for (int i = 0; i < 3; i++)
        keys.push_back(key[i].GetPubKey());

    CMutableTransaction txFrom;
    txFrom.vout.resize(7);

    // First three are standard:
    CScript pay1 = GetScriptForDestination(PKHash(key[0].GetPubKey()));
    BOOST_CHECK(keystore.AddCScript(pay1));
    CScript pay1of3 = GetScriptForMultisig(1, keys);

    txFrom.vout[0].scriptPubKey = GetScriptForDestination(ScriptHash(pay1)); // P2SH (OP_CHECKSIG)
    txFrom.vout[0].nValue = 1000;
    txFrom.vout[1].scriptPubKey = pay1; // ordinary OP_CHECKSIG
    txFrom.vout[1].nValue = 2000;
    txFrom.vout[2].scriptPubKey = pay1of3; // ordinary OP_CHECKMULTISIG
    txFrom.vout[2].nValue = 3000;

    // vout[3] is complicated 1-of-3 AND 2-of-3
    // ... that is OK if wrapped in P2SH:
    CScript oneAndTwo;
    oneAndTwo << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey());
    oneAndTwo << OP_3 << OP_CHECKMULTISIGVERIFY;
    oneAndTwo << OP_2 << ToByteVector(key[3].GetPubKey()) << ToByteVector(key[4].GetPubKey()) << ToByteVector(key[5].GetPubKey());
    oneAndTwo << OP_3 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(oneAndTwo));
    txFrom.vout[3].scriptPubKey = GetScriptForDestination(ScriptHash(oneAndTwo));
    txFrom.vout[3].nValue = 4000;

    // vout[4] is max sigops:
    CScript fifteenSigops; fifteenSigops << OP_1;
    for (unsigned i = 0; i < MAX_P2SH_SIGOPS; i++)
        fifteenSigops << ToByteVector(key[i%3].GetPubKey());
    fifteenSigops << OP_15 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(fifteenSigops));
    txFrom.vout[4].scriptPubKey = GetScriptForDestination(ScriptHash(fifteenSigops));
    txFrom.vout[4].nValue = 5000;

    // vout[5/6] are non-standard because they exceed MAX_P2SH_SIGOPS
    CScript sixteenSigops; sixteenSigops << OP_16 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(sixteenSigops));
    txFrom.vout[5].scriptPubKey = GetScriptForDestination(ScriptHash(sixteenSigops));
    txFrom.vout[5].nValue = 5000;
    CScript twentySigops; twentySigops << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(twentySigops));
    txFrom.vout[6].scriptPubKey = GetScriptForDestination(ScriptHash(twentySigops));
    txFrom.vout[6].nValue = 6000;

    AddCoins(coins, CTransaction(txFrom), 0);

    CMutableTransaction txTo;
    txTo.vout.resize(1);
    txTo.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));

    txTo.vin.resize(5);
    for (int i = 0; i < 5; i++)
    {
        txTo.vin[i].prevout.n = i;
        txTo.vin[i].prevout.hash = txFrom.GetHash();
    }
    SignatureData empty;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 0, SIGHASH_ALL, empty));
    SignatureData empty_b;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 1, SIGHASH_ALL, empty_b));
    SignatureData empty_c;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 2, SIGHASH_ALL, empty_c));
    // SignSignature doesn't know how to sign these. We're
    // not testing validating signatures, so just create
    // dummy signatures that DO include the correct P2SH scripts:
    txTo.vin[3].scriptSig << OP_11 << OP_11 << std::vector<unsigned char>(oneAndTwo.begin(), oneAndTwo.end());
    txTo.vin[4].scriptSig << std::vector<unsigned char>(fifteenSigops.begin(), fifteenSigops.end());

    BOOST_CHECK(::AreInputsStandard(CTransaction(txTo), coins));
    // 22 P2SH sigops for all inputs (1 for vin[0], 6 for vin[3], 15 for vin[4]
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txTo), coins), 22U);

    CMutableTransaction txToNonStd1;
    txToNonStd1.vout.resize(1);
    txToNonStd1.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));
    txToNonStd1.vout[0].nValue = 1000;
    txToNonStd1.vin.resize(1);
    txToNonStd1.vin[0].prevout.n = 5;
    txToNonStd1.vin[0].prevout.hash = txFrom.GetHash();
    txToNonStd1.vin[0].scriptSig << std::vector<unsigned char>(sixteenSigops.begin(), sixteenSigops.end());

    BOOST_CHECK(!::AreInputsStandard(CTransaction(txToNonStd1), coins));
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txToNonStd1), coins), 16U);

    CMutableTransaction txToNonStd2;
    txToNonStd2.vout.resize(1);
    txToNonStd2.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));
    txToNonStd2.vout[0].nValue = 1000;
    txToNonStd2.vin.resize(1);
    txToNonStd2.vin[0].prevout.n = 6;
    txToNonStd2.vin[0].prevout.hash = txFrom.GetHash();
    txToNonStd2.vin[0].scriptSig << std::vector<unsigned char>(twentySigops.begin(), twentySigops.end());

    BOOST_CHECK(!::AreInputsStandard(CTransaction(txToNonStd2), coins));
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txToNonStd2), coins), 20U);
}